

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O1

void __thiscall
Wasm::WasmBytecodeGenerator::GenerateFunction::AutoCleanupGeneratorState::~AutoCleanupGeneratorState
          (AutoCleanupGeneratorState *this)

{
  FunctionBody *pFVar1;
  code *pcVar2;
  bool bVar3;
  uint sourceContextId;
  undefined4 *puVar4;
  WasmBinaryReader *pWVar5;
  
  if (this->gen != (WasmBytecodeGenerator *)0x0) {
    sourceContextId =
         Js::FunctionProxy::GetSourceContextId((FunctionProxy *)(this->gen->m_funcInfo->m_body).ptr)
    ;
    pFVar1 = (this->gen->m_funcInfo->m_body).ptr;
    if ((pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    bVar3 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015cd718,WasmBytecodePhase,sourceContextId,
                       ((pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)
                       ->functionId);
    if (bVar3) {
      Output::Print(L"\nHad Compilation error!");
      Output::Print(L"\n");
      Output::Flush();
    }
    pWVar5 = (WasmBinaryReader *)(this->gen->m_funcInfo->m_customReader).ptr;
    if (pWVar5 == (WasmBinaryReader *)0x0) {
      pWVar5 = (this->gen->m_module->m_reader).ptr;
    }
    (*(pWVar5->super_WasmReaderBase)._vptr_WasmReaderBase[3])();
    (*this->gen->m_originalWriter->_vptr_IWasmByteCodeWriter[3])();
  }
  return;
}

Assistant:

~AutoCleanupGeneratorState()
        {
            if (gen)
            {
                TRACE_WASM(PHASE_TRACE(Js::WasmBytecodePhase, gen->GetFunctionBody()), _u("\nHad Compilation error!"));
                gen->GetReader()->FunctionEnd();
                gen->m_originalWriter->Reset();
            }
        }